

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int inbound_frame_handle_pad(nghttp2_inbound_frame *iframe,nghttp2_frame_hd *hd)

{
  nghttp2_frame_hd *hd_local;
  nghttp2_inbound_frame *iframe_local;
  
  if ((hd->flags & 8) == 0) {
    iframe_local._4_4_ = 0;
  }
  else if (hd->length == 0) {
    iframe_local._4_4_ = -1;
  }
  else {
    inbound_frame_set_mark(iframe,1);
    iframe_local._4_4_ = 1;
  }
  return iframe_local._4_4_;
}

Assistant:

static int inbound_frame_handle_pad(nghttp2_inbound_frame *iframe,
                                    nghttp2_frame_hd *hd) {
  if (hd->flags & NGHTTP2_FLAG_PADDED) {
    if (hd->length < 1) {
      return -1;
    }
    inbound_frame_set_mark(iframe, 1);
    return 1;
  }
  DEBUGF("recv: no padding in payload\n");
  return 0;
}